

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::CommandDiagReset
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aAddr,uint64_t aDiagDataFlags)

{
  type tVar1;
  int iVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  Error error;
  Address dstAddr;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  undefined1 local_210 [8];
  pointer local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  parse_func local_1c0 [1];
  string local_1b0;
  type local_190;
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  Address local_168;
  string *local_148;
  _Any_data local_140;
  code *local_130;
  _Any_data local_120;
  code *local_110;
  _Any_data local_100;
  code *local_f0;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  char local_c8 [16];
  Message local_b8;
  
  local_188 = local_178;
  local_190 = 0;
  local_180 = 0;
  local_178[0] = 0;
  local_168.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148 = aAddr;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_140,aHandler);
  iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar2 == '\0') {
    local_1e8._0_4_ = none_type;
    local_1e0._M_p = "commissioner is not active";
    local_1d8 = 0x1a;
    local_1d0._M_allocated_capacity = 0;
    local_1c0[0] = (parse_func)0x0;
    pcVar5 = "commissioner is not active";
    local_1d0._8_8_ = (format_string_checker<char> *)local_1e8;
    do {
      pcVar3 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar3 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",(format_string_checker<char> *)local_1e8);
      }
      pcVar5 = pcVar3;
    } while (pcVar3 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_1e8;
    fmt::v10::vformat_abi_cxx11_(&local_1b0,(v10 *)0x233cc0,(string_view)ZEXT816(0x1a),args_00);
    local_210._0_4_ = 0xf;
    local_208 = (pointer)(local_200._M_local_buf + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    local_190 = local_210._0_4_;
    std::__cxx11::string::operator=((string *)&local_188,(string *)&local_208);
    if (local_208 != (pointer)(local_200._M_local_buf + 8)) {
      operator_delete(local_208);
    }
    paVar4 = &local_1b0.field_2;
  }
  else {
    local_210 = (undefined1  [8])&local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"/d/dr","");
    coap::Message::SetUriPath((Error *)local_1e8,&local_b8,(string *)local_210);
    local_190 = local_1e8._0_4_;
    std::__cxx11::string::operator=((string *)&local_188,(string *)&local_1e0);
    tVar1 = local_190;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p);
    }
    if (local_210 != (undefined1  [8])&local_200) {
      operator_delete((void *)local_210);
    }
    if (tVar1 != none_type) goto LAB_0019c1eb;
    GetNetDiagTlvTypes((ByteArray *)&local_1b0,aDiagDataFlags);
    tlv::Tlv::Tlv((Tlv *)local_210,kJoinerUdpPort,(ByteArray *)&local_1b0,kNetworkDiag);
    AppendTlv((Error *)local_1e8,&local_b8,(Tlv *)local_210);
    local_190 = local_1e8._0_4_;
    std::__cxx11::string::operator=((string *)&local_188,(string *)&local_1e0);
    tVar1 = local_190;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p);
    }
    if (local_208 != (pointer)0x0) {
      operator_delete(local_208);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if (tVar1 != none_type) goto LAB_0019c1eb;
    iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar2 != '\0') {
      SignRequest((Error *)local_1e8,this,&local_b8,kMeshCoP,true);
      local_190 = local_1e8._0_4_;
      std::__cxx11::string::operator=((string *)&local_188,(string *)&local_1e0);
      tVar1 = local_190;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_p != &local_1d0) {
        operator_delete(local_1e0._M_p);
      }
      if (tVar1 != none_type) goto LAB_0019c1eb;
    }
    local_210 = (undefined1  [8])&local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"meshdiag","");
    local_1e8._0_4_ = none_type;
    local_1e0._M_p = "sending DIAG_RST.ntf";
    local_1d8 = 0x14;
    local_1d0._M_allocated_capacity = 0;
    local_1c0[0] = (parse_func)0x0;
    pcVar5 = "sending DIAG_RST.ntf";
    local_1d0._8_8_ = (format_string_checker<char> *)local_1e8;
    do {
      pcVar3 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar3 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",(format_string_checker<char> *)local_1e8);
      }
      pcVar5 = pcVar3;
    } while (pcVar3 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1e8;
    fmt::v10::vformat_abi_cxx11_
              (&local_1b0,(v10 *)"sending DIAG_RST.ntf",(string_view)ZEXT816(0x14),args);
    Log(kInfo,(string *)local_210,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if (local_210 != (undefined1  [8])&local_200) {
      operator_delete((void *)local_210);
    }
    if (local_148->_M_string_length == 0) {
      std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
      function<ot::commissioner::CommissionerImpl::CommandDiagReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)::__0&,void>
                ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
                 local_100._M_pod_data,(anon_class_32_1_d0c21527 *)&local_140);
      ProxyClient::SendRequest
                (&this->mProxyClient,&local_b8,(ResponseHandler *)&local_100,0xfc00,0xf0bf);
      if (local_f0 != (code *)0x0) {
        (*local_f0)(&local_100,&local_100,__destroy_functor);
      }
    }
    else {
      Address::Set((Error *)local_1e8,&local_168,local_148);
      local_190 = local_1e8._0_4_;
      std::__cxx11::string::operator=((string *)&local_188,(string *)&local_1e0);
      tVar1 = local_190;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_p != &local_1d0) {
        operator_delete(local_1e0._M_p);
      }
      if (tVar1 != none_type) goto LAB_0019c1eb;
      std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
      function<ot::commissioner::CommissionerImpl::CommandDiagReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)::__0&,void>
                ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
                 local_120._M_pod_data,(anon_class_32_1_d0c21527 *)&local_140);
      ProxyClient::SendRequest
                (&this->mProxyClient,&local_b8,(ResponseHandler *)&local_120,&local_168,0xf0bf);
      if (local_110 != (code *)0x0) {
        (*local_110)(&local_120,&local_120,__destroy_functor);
      }
    }
    local_210 = (undefined1  [8])&local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"meshdiag","");
    local_1e8._0_4_ = none_type;
    local_1e0._M_p = "sent DIAG_RST.ntf";
    local_1d8 = 0x11;
    local_1d0._M_allocated_capacity = 0;
    local_1c0[0] = (parse_func)0x0;
    pcVar5 = "sent DIAG_RST.ntf";
    local_1d0._8_8_ = (format_string_checker<char> *)local_1e8;
    do {
      pcVar3 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar3 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",(format_string_checker<char> *)local_1e8);
      }
      pcVar5 = pcVar3;
    } while (pcVar3 != "");
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_1e8;
    fmt::v10::vformat_abi_cxx11_
              (&local_1b0,(v10 *)"sent DIAG_RST.ntf",(string_view)ZEXT816(0x11),args_01);
    Log(kInfo,(string *)local_210,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    paVar4 = &local_200;
    local_1b0._M_dataplus._M_p = (pointer)local_210;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar4) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
LAB_0019c1eb:
  if (local_190 != none_type) {
    local_e0._0_4_ = local_190;
    local_d8._M_p = local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_188,local_188 + local_180);
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Error *)local_e0);
    if (local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p);
    }
  }
  if (local_130 != (code *)0x0) {
    (*local_130)(&local_140,&local_140,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_168.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  return;
}

Assistant:

void CommissionerImpl::CommandDiagReset(ErrorHandler aHandler, const std::string &aAddr, uint64_t aDiagDataFlags)
{
    Error         error;
    Address       dstAddr;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    auto          onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

    exit:
        aHandler(error);
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kDiagRst));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kNetworkDiagTypeList, GetNetDiagTlvTypes(aDiagDataFlags),
                                              tlv::Scope::kNetworkDiag}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    LOG_INFO(LOG_REGION_MESHDIAG, "sending DIAG_RST.ntf");
    if (aAddr.empty())
    {
        mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);
    }
    else
    {
        SuccessOrExit(error = dstAddr.Set(aAddr));
        mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);
    }
    LOG_INFO(LOG_REGION_MESHDIAG, "sent DIAG_RST.ntf");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}